

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Data.cpp
# Opt level: O2

Data * Data::newData(string *str)

{
  char cVar1;
  bool bVar2;
  Integer *this;
  long value;
  stringstream temp;
  ostream local_188 [376];
  
  cVar1 = *(str->_M_dataplus)._M_p;
  if (cVar1 == '-' || (byte)(cVar1 - 0x30U) < 10) {
    std::__cxx11::stringstream::stringstream((stringstream *)&temp);
    std::operator<<(local_188,(string *)str);
    std::istream::_M_extract<long>((long *)&temp);
    this = (Integer *)operator_new(0x18);
    Integer::Integer(this,&value);
    std::__cxx11::stringstream::~stringstream((stringstream *)&temp);
  }
  else {
    bVar2 = std::operator==(str,"true");
    this = (Integer *)trueData;
    if ((!bVar2) && (bVar2 = std::operator==(str,"false"), this = (Integer *)falseData, !bVar2)) {
      this = (Integer *)0x0;
    }
  }
  return &this->super_Data;
}

Assistant:

Data *Data::newData(const std::string &str) {
    if (str[0] == '-' || (str[0] <= '9' && str[0] >= '0')) {
        std::stringstream temp;
        long value;
        temp << str;
        temp >> value;
        return new Integer(value);
    } else if (str == "true") {
        return Data::trueData;
    } else if (str == "false") {
        return Data::falseData;
    } else return NULL;
}